

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_soa.h
# Opt level: O1

GridSOA * embree::sse2::GridSOA::create<embree::BVHN<4>::Allocator_const>
                    (SubdivPatch1Base *patches,uint time_steps,uint x0,uint x1,uint y0,uint y1,
                    Scene *scene,Allocator *alloc,BBox3fa *bounds_o)

{
  FastAllocator *this;
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  pointer *pppTVar3;
  BVHN<4> *pBVar4;
  ThreadLocal2 *this_00;
  iterator __position;
  MutexSys *pMVar5;
  long *plVar6;
  ThreadLocal2 *this_01;
  size_t sVar7;
  ulong uVar8;
  undefined4 in_register_0000008c;
  uint uVar9;
  size_t sVar10;
  uint uVar11;
  ulong uVar12;
  GridSOA *this_02;
  Lock<embree::MutexSys> lock;
  MutexSys local_98;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_90;
  char local_88;
  size_t local_80;
  uint local_74;
  uint local_70;
  uint local_6c;
  GridRange range;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_50;
  ulong local_48;
  undefined8 local_40;
  range<int> local_38;
  
  local_40 = CONCAT44(in_register_0000008c,y1);
  uVar8 = (ulong)time_steps;
  uVar11 = x1 - x0;
  uVar9 = y1 - y0;
  range.u_start = 0;
  range.v_start = 0;
  local_74 = x0;
  local_70 = x1;
  local_6c = y0;
  range.u_end = uVar11;
  range.v_end = uVar9;
  if (time_steps == 1) {
    local_80 = getBVHBytes(&range,0x80,0);
  }
  else {
    sVar10 = getBVHBytes(&range,0xe0,0);
    local_38._begin = 0;
    local_38._end = time_steps - 1;
    local_80 = getTemporalBVHBytes(&local_38,0x100);
    local_80 = local_80 + sVar10 * (time_steps - 1);
  }
  plVar6 = (long *)__tls_get_addr(&PTR_02224d38);
  this_01 = (ThreadLocal2 *)*plVar6;
  if (this_01 == (ThreadLocal2 *)0x0) {
    this_01 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
    MutexSys::MutexSys((MutexSys *)this_01);
    (this_01->alloc)._M_b._M_p = (__pointer_type)0x0;
    (this_01->alloc0).parent = this_01;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc1).parent = this_01;
    (this_01->alloc1).ptr = (char *)0x0;
    (this_01->alloc1).cur = 0;
    (this_01->alloc1).end = 0;
    (this_01->alloc1).allocBlockSize = 0;
    (this_01->alloc1).bytesUsed = 0;
    (this_01->alloc1).bytesWasted = 0;
    *plVar6 = (long)this_01;
    lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    lock.locked = true;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    local_90._M_head_impl = this_01;
    std::
    vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
    ::
    emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
              ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                *)FastAllocator::s_thread_local_allocators,
               (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                *)&local_90);
    if (local_90._M_head_impl != (ThreadLocal2 *)0x0) {
      std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_90,
                 local_90._M_head_impl);
    }
    if (lock.locked == true) {
      MutexSys::unlock(lock.mutex);
    }
  }
  sVar10 = (ulong)(uVar9 + 1) * (ulong)(uVar11 + 1) * 0x10;
  local_98.mutex = (void *)(local_80 + (sVar10 + 8) * uVar8 + 0x30);
  pBVar4 = alloc->bvh;
  this = &pBVar4->alloc;
  this_00 = (this_01->alloc0).parent;
  local_48 = uVar8;
  if (this != (this_00->alloc)._M_b._M_p) {
    local_88 = '\x01';
    local_90._M_head_impl = this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    (this_00->alloc0).allocBlockSize = (pBVar4->alloc).defaultBlockSize;
    (this_00->alloc1).ptr = (char *)0x0;
    (this_00->alloc1).cur = 0;
    (this_00->alloc1).end = 0;
    (this_00->alloc1).allocBlockSize = 0;
    (this_00->alloc1).bytesUsed = 0;
    (this_00->alloc1).bytesWasted = 0;
    (this_00->alloc1).allocBlockSize = (pBVar4->alloc).defaultBlockSize;
    LOCK();
    (this_00->alloc)._M_b._M_p = this;
    UNLOCK();
    lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    lock.locked = true;
    local_50._M_head_impl = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (pBVar4->alloc).thread_local_allocators.
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pBVar4->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(pBVar4->alloc).thread_local_allocators,__position,&local_50._M_head_impl);
    }
    else {
      *__position._M_current = local_50._M_head_impl;
      pppTVar3 = &(pBVar4->alloc).thread_local_allocators.
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    if (lock.locked == true) {
      MutexSys::unlock(lock.mutex);
    }
    if (local_88 == '\x01') {
      MutexSys::unlock(&(local_90._M_head_impl)->mutex);
    }
  }
  psVar1 = &(this_01->alloc0).bytesUsed;
  *psVar1 = (long)local_98.mutex + *psVar1;
  sVar7 = (this_01->alloc0).cur;
  uVar8 = (ulong)(-(int)sVar7 & 0xf);
  uVar12 = (long)local_98.mutex + uVar8 + sVar7;
  (this_01->alloc0).cur = uVar12;
  if ((this_01->alloc0).end < uVar12) {
    (this_01->alloc0).cur = sVar7;
    pMVar5 = (MutexSys *)(this_01->alloc0).allocBlockSize;
    if (pMVar5 < (MutexSys *)((long)local_98.mutex << 2)) {
      this_02 = (GridSOA *)FastAllocator::malloc(this,(size_t)&local_98);
    }
    else {
      lock.mutex = pMVar5;
      this_02 = (GridSOA *)FastAllocator::malloc(this,(size_t)&lock);
      (this_01->alloc0).ptr = (char *)this_02;
      sVar7 = ((this_01->alloc0).end - (this_01->alloc0).cur) + (this_01->alloc0).bytesWasted;
      (this_01->alloc0).bytesWasted = sVar7;
      (this_01->alloc0).cur = 0;
      (this_01->alloc0).end = (size_t)lock.mutex;
      (this_01->alloc0).cur = (size_t)local_98.mutex;
      if (lock.mutex < local_98.mutex) {
        (this_01->alloc0).cur = 0;
        lock.mutex = (MutexSys *)(this_01->alloc0).allocBlockSize;
        this_02 = (GridSOA *)FastAllocator::malloc(this,(size_t)&lock);
        (this_01->alloc0).ptr = (char *)this_02;
        sVar7 = ((this_01->alloc0).end - (this_01->alloc0).cur) + (this_01->alloc0).bytesWasted;
        (this_01->alloc0).bytesWasted = sVar7;
        (this_01->alloc0).cur = 0;
        (this_01->alloc0).end = (size_t)lock.mutex;
        (this_01->alloc0).cur = (size_t)local_98.mutex;
        if (lock.mutex < local_98.mutex) {
          (this_01->alloc0).cur = 0;
          this_02 = (GridSOA *)0x0;
          goto LAB_00e60407;
        }
      }
      (this_01->alloc0).bytesWasted = sVar7;
    }
  }
  else {
    psVar1 = &(this_01->alloc0).bytesWasted;
    *psVar1 = *psVar1 + uVar8;
    this_02 = (GridSOA *)((this_01->alloc0).ptr + (uVar12 - (long)local_98.mutex));
  }
LAB_00e60407:
  GridSOA(this_02,patches,(uint)local_48,local_74,local_70,local_6c,(uint)local_40,
          (uint)patches->grid_u_res,(uint)patches->grid_v_res,
          (SubdivMesh *)(scene->geometries).items[patches->geom].ptr,local_80,sVar10,bounds_o);
  return this_02;
}

Assistant:

static GridSOA* create(const SubdivPatch1Base* patches, const unsigned time_steps,
                               unsigned x0, unsigned x1, unsigned y0, unsigned y1, 
                               const Scene* scene, Allocator& alloc, BBox3fa* bounds_o = nullptr)
      {
        const unsigned width = x1-x0+1;  
        const unsigned height = y1-y0+1; 
        const GridRange range(0,width-1,0,height-1);
        size_t bvhBytes = 0;
        if (time_steps == 1) 
          bvhBytes = getBVHBytes(range,sizeof(BVH4::AABBNode),0);
        else {
          bvhBytes = (time_steps-1)*getBVHBytes(range,sizeof(BVH4::AABBNodeMB),0);
          bvhBytes += getTemporalBVHBytes(make_range(0,int(time_steps-1)),sizeof(BVH4::AABBNodeMB4D));
        }
        const size_t gridBytes = 4*size_t(width)*size_t(height)*sizeof(float);  
        size_t rootBytes = time_steps*sizeof(BVH4::NodeRef);
#if !defined(__64BIT__)
        rootBytes += 4; // We read 2 elements behind the grid. As we store at least 8 root bytes after the grid we are fine in 64 bit mode. But in 32 bit mode we have to do additional padding.
#endif
        void* data = alloc(offsetof(GridSOA,data)+bvhBytes+time_steps*gridBytes+rootBytes);
        assert(data);
        return new (data) GridSOA(patches,time_steps,x0,x1,y0,y1,patches->grid_u_res,patches->grid_v_res,scene->get<SubdivMesh>(patches->geomID()),bvhBytes,gridBytes,bounds_o);
      }